

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O0

int pospopcnt_u16_method(PPOPCNT_U16_METHODS method,uint16_t *data,uint32_t len,uint32_t *flags)

{
  uint32_t *in_RCX;
  uint32_t in_EDX;
  uint16_t *in_RSI;
  uint in_EDI;
  uint32_t *in_stack_00000058;
  uint32_t in_stack_00000064;
  uint16_t *in_stack_00000068;
  uint32_t *in_stack_00000070;
  uint32_t in_stack_0000007c;
  uint16_t *in_stack_00000080;
  uint32_t *in_stack_00000090;
  uint32_t in_stack_0000009c;
  uint16_t *in_stack_000000a0;
  uint32_t *in_stack_000000b0;
  uint32_t in_stack_000000bc;
  uint16_t *in_stack_000000c0;
  uint32_t *in_stack_000000c8;
  undefined4 in_stack_000000d0;
  uint32_t in_stack_000000d4;
  undefined4 in_stack_000000d8;
  uint32_t in_stack_000000dc;
  uint16_t *in_stack_000000e0;
  uint32_t *in_stack_00000160;
  uint32_t in_stack_0000016c;
  uint16_t *in_stack_00000170;
  uint32_t *in_stack_00000178;
  uint32_t in_stack_00000184;
  uint16_t *in_stack_00000188;
  uint32_t *in_stack_000001a8;
  uint32_t in_stack_000001b4;
  uint16_t *in_stack_000001b8;
  uint32_t *in_stack_00000250;
  uint32_t in_stack_0000025c;
  uint16_t *in_stack_00000260;
  uint32_t *in_stack_00000290;
  uint32_t in_stack_0000029c;
  uint16_t *in_stack_000002a0;
  uint32_t *in_stack_00000380;
  uint32_t in_stack_0000038c;
  uint16_t *in_stack_00000390;
  uint32_t *in_stack_000003a8;
  uint32_t in_stack_000003b4;
  uint16_t *in_stack_000003b8;
  uint32_t *in_stack_000003f8;
  uint32_t in_stack_00000404;
  uint16_t *in_stack_00000408;
  uint32_t *in_stack_00000430;
  uint32_t in_stack_0000043c;
  uint16_t *in_stack_00000440;
  uint32_t *in_stack_00000450;
  uint32_t in_stack_0000045c;
  uint16_t *in_stack_00000460;
  uint32_t *in_stack_00000478;
  uint32_t in_stack_00000484;
  uint32_t *in_stack_00000488;
  uint32_t in_stack_00000494;
  uint16_t *in_stack_00000498;
  uint32_t *in_stack_00000568;
  uint32_t in_stack_00000574;
  uint16_t *in_stack_00000578;
  uint32_t *in_stack_000006d0;
  uint32_t in_stack_000006dc;
  uint16_t *in_stack_000006e0;
  uint32_t *in_stack_000007c0;
  uint32_t in_stack_000007cc;
  uint16_t *in_stack_000007d0;
  uint32_t *in_stack_000007e8;
  undefined4 in_stack_000007f0;
  uint32_t in_stack_000007f4;
  undefined4 in_stack_000007f8;
  uint32_t in_stack_000007fc;
  uint16_t *in_stack_00000800;
  uint32_t *in_stack_00000838;
  uint32_t in_stack_00000844;
  uint16_t *in_stack_00000848;
  uint32_t *in_stack_000009e8;
  uint32_t in_stack_000009f4;
  uint16_t *in_stack_000009f8;
  uint32_t *in_stack_00000a30;
  uint32_t in_stack_00000a3c;
  uint16_t *in_stack_00000a40;
  uint32_t *in_stack_00000cb8;
  uint32_t in_stack_00000cc4;
  uint16_t *in_stack_00000cc8;
  uint32_t *in_stack_000010f8;
  uint32_t in_stack_00001104;
  uint16_t *in_stack_00001108;
  uint32_t *in_stack_00001708;
  uint32_t in_stack_00001714;
  uint16_t *in_stack_00001718;
  uint32_t *in_stack_00002e30;
  uint32_t in_stack_00002e3c;
  uint16_t *in_stack_00002e40;
  undefined4 in_stack_ffffffffffffffe8;
  int local_4;
  
  switch((uint32_t *)(ulong)in_EDI) {
  case (uint32_t *)0x0:
    local_4 = pospopcnt_u16((uint16_t *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),
                            (uint32_t)((ulong)in_RCX >> 0x20),(uint32_t *)(ulong)in_EDI);
    break;
  case (uint32_t *)0x1:
    local_4 = pospopcnt_u16_scalar_naive(in_RSI,in_EDX,in_RCX);
    break;
  case (uint32_t *)0x2:
    local_4 = pospopcnt_u16_scalar_naive_nosimd(in_RSI,in_EDX,in_RCX);
    break;
  case (uint32_t *)0x3:
    local_4 = pospopcnt_u16_scalar_partition
                        (in_stack_00000800,in_stack_000007fc,
                         (uint32_t *)CONCAT44(in_stack_000007f4,in_stack_000007f0));
    break;
  case (uint32_t *)0x4:
    local_4 = pospopcnt_u16_scalar_hist1x4
                        (in_stack_00000800,in_stack_000007fc,
                         (uint32_t *)CONCAT44(in_stack_000007f4,in_stack_000007f0));
    break;
  case (uint32_t *)0x5:
    local_4 = pospopcnt_u16_scalar_umul128(in_stack_00000080,in_stack_0000007c,in_stack_00000070);
    break;
  case (uint32_t *)0x6:
    local_4 = pospopcnt_u16_scalar_umul128_unroll2
                        (in_stack_000000a0,in_stack_0000009c,in_stack_00000090);
    break;
  case (uint32_t *)0x7:
    local_4 = pospopcnt_u16_sse_single
                        ((uint16_t *)CONCAT44(in_stack_000000dc,in_stack_000000d8),in_stack_000000d4
                         ,in_stack_000000c8);
    break;
  case (uint32_t *)0x8:
    local_4 = pospopcnt_u16_sse_blend_popcnt(in_RSI,in_EDX,in_RCX);
    break;
  case (uint32_t *)0x9:
    local_4 = pospopcnt_u16_sse_blend_popcnt_unroll4
                        (in_stack_00000068,in_stack_00000064,in_stack_00000058);
    break;
  case (uint32_t *)0xa:
    local_4 = pospopcnt_u16_sse_blend_popcnt_unroll8
                        (in_stack_00000188,in_stack_00000184,in_stack_00000178);
    break;
  case (uint32_t *)0xb:
    local_4 = pospopcnt_u16_sse_blend_popcnt_unroll16
                        (in_stack_000003b8,in_stack_000003b4,in_stack_000003a8);
    break;
  case (uint32_t *)0xc:
    local_4 = pospopcnt_u16_sse_sad(in_stack_00000188,in_stack_00000184,in_stack_00000178);
    break;
  case (uint32_t *)0xd:
    local_4 = pospopcnt_u16_sse_harvey_seal(in_stack_000002a0,in_stack_0000029c,in_stack_00000290);
    break;
  case (uint32_t *)0xe:
    local_4 = pospopcnt_u16_avx2_popcnt(in_stack_00000460,in_stack_0000045c,in_stack_00000450);
    break;
  case (uint32_t *)0xf:
    local_4 = pospopcnt_u16_avx2(in_stack_00000578,in_stack_00000574,in_stack_00000568);
    break;
  case (uint32_t *)0x10:
    local_4 = pospopcnt_u16_avx2_naive_counter
                        (in_stack_00000498,in_stack_00000494,in_stack_00000488);
    break;
  case (uint32_t *)0x11:
    local_4 = pospopcnt_u16_avx2_single
                        (in_stack_000000e0,in_stack_000000dc,
                         (uint32_t *)CONCAT44(in_stack_000000d4,in_stack_000000d0));
    break;
  case (uint32_t *)0x12:
    local_4 = pospopcnt_u16_avx2_lemire(in_stack_00000260,in_stack_0000025c,in_stack_00000250);
    break;
  case (uint32_t *)0x13:
    local_4 = pospopcnt_u16_avx2_lemire2(in_stack_000006e0,in_stack_000006dc,in_stack_000006d0);
    break;
  case (uint32_t *)0x14:
    local_4 = pospopcnt_u16_avx2_blend_popcnt(in_stack_000000a0,in_stack_0000009c,in_stack_00000090)
    ;
    break;
  case (uint32_t *)0x15:
    local_4 = pospopcnt_u16_avx2_blend_popcnt_unroll4
                        (in_stack_000001b8,in_stack_000001b4,in_stack_000001a8);
    break;
  case (uint32_t *)0x16:
    local_4 = pospopcnt_u16_avx2_blend_popcnt_unroll8
                        (in_stack_00000408,in_stack_00000404,in_stack_000003f8);
    break;
  case (uint32_t *)0x17:
    local_4 = pospopcnt_u16_avx2_blend_popcnt_unroll16
                        (in_stack_00000848,in_stack_00000844,in_stack_00000838);
    break;
  case (uint32_t *)0x18:
    local_4 = pospopcnt_u16_avx2_adder_forest(in_stack_00001718,in_stack_00001714,in_stack_00001708)
    ;
    break;
  case (uint32_t *)0x19:
    local_4 = pospopcnt_u16_avx2_harvey_seal(in_stack_00000440,in_stack_0000043c,in_stack_00000430);
    break;
  case (uint32_t *)0x1a:
    local_4 = pospopcnt_u16_avx512(in_stack_00001108,in_stack_00001104,in_stack_000010f8);
    break;
  case (uint32_t *)0x1b:
    local_4 = pospopcnt_u16_avx512bw_popcnt32_mask
                        ((uint16_t *)in_stack_00000488,in_stack_00000484,in_stack_00000478);
    break;
  case (uint32_t *)0x1c:
    local_4 = pospopcnt_u16_avx512bw_popcnt64_mask
                        ((uint16_t *)in_stack_00000488,in_stack_00000484,in_stack_00000478);
    break;
  case (uint32_t *)0x1d:
    local_4 = pospopcnt_u16_avx512_masked_ops(in_stack_000000c0,in_stack_000000bc,in_stack_000000b0)
    ;
    break;
  case (uint32_t *)0x1e:
    local_4 = pospopcnt_u16_avx512_popcnt(in_stack_00000cc8,in_stack_00000cc4,in_stack_00000cb8);
    break;
  case (uint32_t *)0x1f:
    local_4 = pospopcnt_u16_avx512bw_blend_popcnt
                        (in_stack_00000170,in_stack_0000016c,in_stack_00000160);
    break;
  case (uint32_t *)0x20:
    local_4 = pospopcnt_u16_avx512bw_blend_popcnt_unroll4
                        (in_stack_00000390,in_stack_0000038c,in_stack_00000380);
    break;
  case (uint32_t *)0x21:
    local_4 = pospopcnt_u16_avx512bw_blend_popcnt_unroll8
                        (in_stack_000007d0,in_stack_000007cc,in_stack_000007c0);
    break;
  case (uint32_t *)0x22:
    local_4 = pospopcnt_u16_avx512_mula2(in_stack_000009f8,in_stack_000009f4,in_stack_000009e8);
    break;
  case (uint32_t *)0x23:
    local_4 = pospopcnt_u16_avx512bw_adder_forest
                        (in_stack_00002e40,in_stack_00002e3c,in_stack_00002e30);
    break;
  case (uint32_t *)0x24:
    local_4 = pospopcnt_u16_avx512bw_harvey_seal
                        ((uint16_t *)CONCAT44(in_stack_000007fc,in_stack_000007f8),in_stack_000007f4
                         ,in_stack_000007e8);
    break;
  case (uint32_t *)0x25:
    local_4 = pospopcnt_u16_avx512vbmi_harvey_seal
                        (in_stack_00000a40,in_stack_00000a3c,in_stack_00000a30);
    break;
  default:
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int pospopcnt_u16_method(PPOPCNT_U16_METHODS method, const uint16_t* data, uint32_t len, uint32_t* flags) {
    switch(method) {
    case(PPOPCNT_AUTO): return pospopcnt_u16(data, len, flags);
    case(PPOPCNT_SCALAR): return pospopcnt_u16_scalar_naive(data, len, flags);
    case(PPOPCNT_SCALAR_NOSIMD): return pospopcnt_u16_scalar_naive_nosimd(data, len, flags);
    case(PPOPCNT_SCALAR_PARTITION): return pospopcnt_u16_scalar_partition(data, len, flags);
    case(PPOPCNT_SCALAR_HIST1X4): return pospopcnt_u16_scalar_hist1x4(data, len, flags);
    case(PPOPCNT_SCALAR_UMUL128): return pospopcnt_u16_scalar_umul128(data, len, flags);
    case(PPOPCNT_SCALAR_UMUL128_UR2): return pospopcnt_u16_scalar_umul128_unroll2(data, len, flags);
    case(PPOPCNT_SSE_SINGLE): return pospopcnt_u16_sse_single(data, len, flags);
    case(PPOPCNT_SSE_BLEND_POPCNT): return pospopcnt_u16_sse_blend_popcnt(data, len, flags);
    case(PPOPCNT_SSE_BLEND_POPCNT_UR4): return pospopcnt_u16_sse_blend_popcnt_unroll4(data, len, flags);
    case(PPOPCNT_SSE_BLEND_POPCNT_UR8): return pospopcnt_u16_sse_blend_popcnt_unroll8(data, len, flags);
    case(PPOPCNT_SSE_BLEND_POPCNT_UR16): return pospopcnt_u16_sse_blend_popcnt_unroll16(data, len, flags);
    case(PPOPCNT_SSE_SAD): return pospopcnt_u16_sse_sad(data, len, flags);
    case(PPOPCNT_SSE_HARVEY_SEAL): return pospopcnt_u16_sse_harvey_seal(data, len, flags);
    case(PPOPCNT_AVX2_POPCNT): return pospopcnt_u16_avx2_popcnt(data, len, flags);
    case(PPOPCNT_AVX2): return pospopcnt_u16_avx2(data, len, flags);
    case(PPOPCNT_AVX2_POPCNT_NAIVE): return pospopcnt_u16_avx2_naive_counter(data, len, flags);
    case(PPOPCNT_AVX2_SINGLE): return pospopcnt_u16_avx2_single(data, len, flags);
    case(PPOPCNT_AVX2_LEMIRE1): return pospopcnt_u16_avx2_lemire(data, len, flags);
    case(PPOPCNT_AVX2_LEMIRE2): return pospopcnt_u16_avx2_lemire2(data, len, flags);
    case(PPOPCNT_AVX2_BLEND_POPCNT): return pospopcnt_u16_avx2_blend_popcnt(data, len, flags);
    case(PPOPCNT_AVX2_BLEND_POPCNT_UR4): return pospopcnt_u16_avx2_blend_popcnt_unroll4(data, len, flags);
    case(PPOPCNT_AVX2_BLEND_POPCNT_UR8): return pospopcnt_u16_avx2_blend_popcnt_unroll8(data, len, flags);
    case(PPOPCNT_AVX2_BLEND_POPCNT_UR16): return pospopcnt_u16_avx2_blend_popcnt_unroll16(data, len, flags);
    case(PPOPCNT_AVX2_ADDER_FOREST): return pospopcnt_u16_avx2_adder_forest(data, len, flags);
    case(PPOPCNT_AVX2_HARVEY_SEAL): return pospopcnt_u16_avx2_harvey_seal(data, len, flags);
    case(PPOPCNT_AVX512): return pospopcnt_u16_avx512(data, len, flags);
    case(PPOPCNT_AVX512BW_MASK32): return pospopcnt_u16_avx512bw_popcnt32_mask(data, len, flags);
    case(PPOPCNT_AVX512BW_MASK64): return pospopcnt_u16_avx512bw_popcnt64_mask(data, len, flags);
    case(PPOSCNT_AVX512_MASKED_OPS): return pospopcnt_u16_avx512_masked_ops(data, len, flags);
    case(PPOPCNT_AVX512_POPCNT): return pospopcnt_u16_avx512_popcnt(data, len, flags);
    case(PPOPCNT_AVX512BW_BLEND_POPCNT): return pospopcnt_u16_avx512bw_blend_popcnt(data, len, flags);
    case(PPOPCNT_AVX512BW_BLEND_POPCNT_UR4): return pospopcnt_u16_avx512bw_blend_popcnt_unroll4(data, len, flags);
    case(PPOPCNT_AVX512BW_BLEND_POPCNT_UR8): return pospopcnt_u16_avx512bw_blend_popcnt_unroll8(data, len, flags);
    case(PPOPCNT_AVX512BW_ADDER_FOREST): return pospopcnt_u16_avx512bw_adder_forest(data, len, flags);
    case(PPOPCNT_AVX512_MULA2): return pospopcnt_u16_avx512_mula2(data, len, flags);
    case(PPOPCNT_AVX512BW_HARVEY_SEAL): return pospopcnt_u16_avx512bw_harvey_seal(data, len, flags);
    case(PPOPCNT_AVX512VBMI_HARVEY_SEAL): return pospopcnt_u16_avx512vbmi_harvey_seal(data, len, flags);
    }
    assert(0);
    return 0; /* unreachable, but some compilers complain without it */
}